

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.cpp
# Opt level: O0

void __thiscall HawkTracer::parser::Event::Value::Value(Value *this,Value *other)

{
  FieldTypeId FVar1;
  size_t sVar2;
  void *pvVar3;
  Event *this_00;
  Value *other_local;
  Value *this_local;
  
  this->field = (EventKlassField *)0x0;
  this->field = other->field;
  if (this->field != (EventKlassField *)0x0) {
    FVar1 = EventKlassField::get_type_id(this->field);
    if (FVar1 == STRING) {
      if ((other->value).f_UINT64 == 0) {
        (this->value).f_UINT64 = 0;
      }
      else {
        sVar2 = strlen((other->value).f_STRING);
        pvVar3 = malloc(sVar2 + 1);
        (this->value).f_POINTER = pvVar3;
        strcpy((this->value).f_STRING,(other->value).f_STRING);
      }
    }
    else if (FVar1 == STRUCT) {
      if ((other->value).f_UINT64 == 0) {
        (this->value).f_UINT64 = 0;
      }
      else {
        this_00 = (Event *)operator_new(0x50);
        Event(this_00,(other->value).f_EVENT);
        (this->value).f_EVENT = this_00;
      }
    }
    else {
      this->value = other->value;
    }
  }
  return;
}

Assistant:

Event::Value::Value(const Value& other)
{
    field = other.field;

    if (!field)
    {
        return;
    }

    switch (field->get_type_id())
    {
    case FieldTypeId::STRING:
        if (other.value.f_STRING)
        {
            value.f_STRING = (char*)malloc(strlen(other.value.f_STRING) + 1);
            strcpy(value.f_STRING, other.value.f_STRING);
        }
        else
        {
            value.f_STRING = nullptr;
        }
        break;
    case FieldTypeId::STRUCT:
        if (other.value.f_EVENT)
        {
            value.f_EVENT = new Event(*other.value.f_EVENT);
        }
        else
        {
            value.f_EVENT = nullptr;
        }
        break;
    default:
        value = other.value;
    }
}